

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

ItemList *
Lib::UniquePersistentIterator<Kernel::BooleanSubtermIt>::getUniqueItemList
          (BooleanSubtermIt *inn,size_t *sizeRef)

{
  bool bVar1;
  int iVar2;
  TermList elem;
  List<Kernel::TermList> *l;
  size_t sVar3;
  Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  iset;
  Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_30;
  undefined4 extraout_var;
  
  Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_30);
  sVar3 = 0;
  l = (List<Kernel::TermList> *)0x0;
  do {
    *sizeRef = sVar3;
    do {
      iVar2 = (*(inn->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore[2])(inn);
      if ((char)iVar2 == '\0') {
        Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&local_30);
        return l;
      }
      elem._content._0_4_ =
           (*(inn->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore[3])(inn);
      elem._content._4_4_ = extraout_var;
      bVar1 = DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                        ((DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                          *)local_30._self._M_t.
                            super___uniq_ptr_impl<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                            .
                            super__Head_base<0UL,_Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                            ._M_head_impl,elem._content);
    } while (!bVar1);
    l = List<Kernel::TermList>::cons(elem,l);
    sVar3 = *sizeRef + 1;
  } while( true );
}

Assistant:

static ItemList* getUniqueItemList(Inner& inn, size_t& sizeRef)
  {
    ItemList* res=0;
    Recycled<ItemSet> iset;

    sizeRef=0;
    while(inn.hasNext()) {
      T el=inn.next();
      if(iset->insert(el)) {
	ItemList::push(el, res);
	sizeRef++;
      }
    }

    return res;
  }